

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::Base::Base(Base *this,ListRecord *list)

{
  invoke_result_t<ranges::views::stride_base_fn,_ranges::ref_view<const_std::vector<double>_>,_long>
  local_60;
  drop_exactly_view<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>
  local_40;
  
  ListRecord::ListRecord(&this->super_ListRecord,list);
  EP(&local_60,this);
  local_40.n_ = (this->super_ListRecord).metadata.fields.
                super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
                _M_head_impl;
  local_40.rng_.super_stride_view_base<ranges::ref_view<const_std::vector<double>_>_>.stride_ =
       local_60.super_stride_view_base<ranges::ref_view<const_std::vector<double>_>_>.stride_;
  local_40.rng_.super_stride_view_base<ranges::ref_view<const_std::vector<double>_>_>.offset_ =
       local_60.super_stride_view_base<ranges::ref_view<const_std::vector<double>_>_>.offset_;
  local_40.rng_.super_stride_view_base<ranges::ref_view<const_std::vector<double>_>_>.
  super_stride_view_adaptor<ranges::ref_view<const_std::vector<double>_>_>._0_8_ =
       local_60.super_stride_view_base<ranges::ref_view<const_std::vector<double>_>_>.
       super_stride_view_adaptor<ranges::ref_view<const_std::vector<double>_>_>._0_8_;
  local_40.rng_.super_stride_view_base<ranges::ref_view<const_std::vector<double>_>_>.
  super_stride_view_adaptor<ranges::ref_view<const_std::vector<double>_>_>.rng_.rng_ =
       local_60.super_stride_view_base<ranges::ref_view<const_std::vector<double>_>_>.
       super_stride_view_adaptor<ranges::ref_view<const_std::vector<double>_>_>.rng_.rng_;
  verifySorted<ranges::drop_exactly_view<ranges::stride_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>>,char[7]>
            (&local_40,(char (*) [7])"Energy");
  verifySize((int)((ulong)((long)(this->super_ListRecord).data.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(this->super_ListRecord).data.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 3),
             (int)((_Head_base<3UL,_long,_false> *)
                  ((long)&(this->super_ListRecord).metadata.fields.
                          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<2UL,_long,_long,_long,_long>.
                          super__Tuple_impl<3UL,_long,_long,_long> + 0x10))->_M_head_impl,
             *(int *)&(this->super_ListRecord).metadata.fields.
                      super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                      super__Tuple_impl<2UL,_long,_long,_long,_long>.
                      super__Tuple_impl<3UL,_long,_long,_long>);
  return;
}

Assistant:

Base( ListRecord&& list ) :
  ListRecord( std::move( list ) ) {

  verifySorted( this->energies() | ranges::views::drop_exactly( this->ND() ),
                "Energy" );
  verifySize( this->NW(), this->NA(), this->NEP() );
}